

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

void watch_dig(monst *mtmp,xchar x,xchar y,boolean zap)

{
  level *plVar1;
  boolean bVar2;
  char *local_28;
  char *str;
  rm *loc;
  boolean zap_local;
  xchar y_local;
  monst *pmStack_10;
  xchar x_local;
  monst *mtmp_local;
  
  plVar1 = level;
  bVar2 = in_town((int)x,(int)y);
  if ((bVar2 != '\0') &&
     (((((bVar2 = closed_door(level,(int)x,(int)y), bVar2 != '\0' ||
         (plVar1->locations[x][y].typ == '\x0f')) ||
        ((plVar1->locations[x][y].typ != '\0' && (plVar1->locations[x][y].typ < '\r')))) ||
       ((plVar1->locations[x][y].typ == '\x1c' || (plVar1->locations[x][y].typ == '\r')))) ||
      (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
       (plVar1->locations[x][y].typ == '\0')))))) {
    pmStack_10 = mtmp;
    if (mtmp == (monst *)0x0) {
      pmStack_10 = level->monlist;
      while ((pmStack_10 != (monst *)0x0 &&
             ((((pmStack_10->mhp < 1 ||
                (((pmStack_10->data != mons + 0x125 && (pmStack_10->data != mons + 0x126)) ||
                 ((*(uint *)&pmStack_10->field_0x60 >> 0x11 & 1) == 0)))) ||
               (((((u.uprops[0xd].intrinsic != 0 || (u.uprops[0xd].extrinsic != 0)) ||
                  (youmonst.data == mons + 0x9e)) || (youmonst.data == mons + 0x7b)) &&
                ((u.uprops[0xd].blocked == 0 && ((pmStack_10->data->mflags1 & 0x1000000) == 0))))))
              || ((((byte)u._1052_1_ >> 1 & 1) != 0 ||
                  ((((((byte)u._1052_1_ >> 5 & 1) != 0 ||
                     ((*(uint *)&pmStack_10->field_0x60 >> 9 & 1) != 0)) ||
                    ((viz_array[pmStack_10->my][pmStack_10->mx] & 1U) == 0)) ||
                   (((viz_array[pmStack_10->my][pmStack_10->mx] & 1U) == 0 ||
                    ((*(uint *)&pmStack_10->field_0x60 >> 0x16 & 1) == 0))))))))))) {
        pmStack_10 = pmStack_10->nmon;
      }
    }
    if (pmStack_10 != (monst *)0x0) {
      if ((zap == '\0') && (digging.warned == '\0')) {
        if (plVar1->locations[x][y].typ == '\x17') {
          local_28 = "door";
        }
        else if ((plVar1->locations[x][y].typ == '\r') ||
                (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
                 (plVar1->locations[x][y].typ == '\0')))) {
          local_28 = "tree";
        }
        else if (plVar1->locations[x][y].typ < '\x11') {
          local_28 = "wall";
        }
        else {
          local_28 = "fountain";
        }
        verbalize("Hey, stop damaging that %s!",local_28);
        digging.warned = '\x01';
      }
      else {
        verbalize("Halt, vandal!  You\'re under arrest!");
        angry_guards((flags.soundok != '\0' ^ 0xffU) & 1);
      }
      bVar2 = is_digging();
      if (bVar2 != '\0') {
        stop_occupation();
      }
    }
  }
  return;
}

Assistant:

void watch_dig(struct monst *mtmp, xchar x, xchar y, boolean zap)
{
	struct rm *loc = &level->locations[x][y];

	if (in_town(x, y) &&
	    (closed_door(level, x, y) || loc->typ == SDOOR ||
	     IS_WALL(loc->typ) || IS_FOUNTAIN(loc->typ) ||
	     IS_TREE(level, loc->typ))) {
	    if (!mtmp) {
		for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		    if (DEADMONSTER(mtmp)) continue;
		    if ((mtmp->data == &mons[PM_WATCHMAN] ||
			 mtmp->data == &mons[PM_WATCH_CAPTAIN]) &&
			mtmp->mcansee && m_canseeu(mtmp) &&
			couldsee(mtmp->mx, mtmp->my) && mtmp->mpeaceful)
			break;
		}
	    }

	    if (mtmp) {
		if (zap || digging.warned) {
		    verbalize("Halt, vandal!  You're under arrest!");
		    angry_guards(!(flags.soundok));
		} else {
		    const char *str;

		    if (IS_DOOR(loc->typ))
			str = "door";
		    else if (IS_TREE(level, loc->typ))
			str = "tree";
		    else if (IS_ROCK(loc->typ))
			str = "wall";
		    else
			str = "fountain";
		    verbalize("Hey, stop damaging that %s!", str);
		    digging.warned = TRUE;
		}
		if (is_digging())
		    stop_occupation();
	    }
	}
}